

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPossibleRsRule(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 0x73) {
    if (((iVar1 != 2) && (iVar1 != 0xd)) && (iVar1 != 0x53)) {
      return false;
    }
  }
  else if (iVar1 < 0xf9) {
    if ((iVar1 != 0x73) && (iVar1 != 0xb6)) {
      return false;
    }
  }
  else if ((iVar1 != 0xf9) && (iVar1 != 0x104)) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleRsRule(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenBrace:
        case TokenKind::IfKeyword:
        case TokenKind::RepeatKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::Identifier:
        case TokenKind::RandKeyword:
        case TokenKind::Or:
            return true;
        default:
            return false;
    }
}